

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedPtr.hpp
# Opt level: O3

void __thiscall SharedPtr<r>::~SharedPtr(SharedPtr<r> *this)

{
  atomic<unsigned_long> *paVar1;
  r *prVar2;
  
  paVar1 = this->pointersAmount;
  if (paVar1 != (atomic<unsigned_long> *)0x0) {
    LOCK();
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if ((this->pointersAmount->super___atomic_base<unsigned_long>)._M_i == 0) {
      operator_delete(this->pointersAmount,8);
      prVar2 = this->data;
      if (prVar2 != (r *)0x0) {
        *prVar2->lakmus = 1;
      }
      operator_delete(prVar2,8);
    }
    this->data = (r *)0x0;
    this->pointersAmount = (atomic<unsigned_long> *)0x0;
  }
  return;
}

Assistant:

~SharedPtr() {
		if (pointersAmount == nullptr) return;
		--(*pointersAmount);
		if ((*pointersAmount) == 0) {
			delete pointersAmount;
			delete data;
		}
		pointersAmount = nullptr;
		data = nullptr;
	}